

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeReset(Vdbe *p)

{
  sqlite3 *db;
  char *zFormat;
  
  db = p->db;
  sqlite3VdbeHalt(p);
  if (p->pc < 0) {
    if ((p->rc != 0) && ((p->field_0xc1 & 1) != 0)) {
      zFormat = "%s";
      if (p->zErrMsg == (char *)0x0) {
        zFormat = (char *)0x0;
      }
      sqlite3ErrorWithMsg(db,p->rc,zFormat);
      if (p->zErrMsg != (char *)0x0) {
        sqlite3DbFreeNN(db,p->zErrMsg);
      }
      p->zErrMsg = (char *)0x0;
    }
  }
  else {
    sqlite3VdbeTransferError(p);
    if (p->zErrMsg != (char *)0x0) {
      sqlite3DbFreeNN(db,p->zErrMsg);
    }
    p->zErrMsg = (char *)0x0;
    if ((*(ushort *)&p->field_0xc1 & 0x20) != 0) {
      *(ushort *)&p->field_0xc1 = *(ushort *)&p->field_0xc1 | 1;
    }
  }
  if (p->zErrMsg != (char *)0x0) {
    sqlite3DbFreeNN(p->db,p->zErrMsg);
  }
  p->pResultSet = (Mem *)0x0;
  p->zErrMsg = (char *)0x0;
  p->magic = 0x48fa9f76;
  return db->errMask & p->rc;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeReset(Vdbe *p){
  sqlite3 *db;
  db = p->db;

  /* If the VM did not run to completion or if it encountered an
  ** error, then it might not have been halted properly.  So halt
  ** it now.
  */
  sqlite3VdbeHalt(p);

  /* If the VDBE has be run even partially, then transfer the error code
  ** and error message from the VDBE into the main database structure.  But
  ** if the VDBE has just been set to run but has not actually executed any
  ** instructions yet, leave the main database error information unchanged.
  */
  if( p->pc>=0 ){
    vdbeInvokeSqllog(p);
    sqlite3VdbeTransferError(p);
    sqlite3DbFree(db, p->zErrMsg);
    p->zErrMsg = 0;
    if( p->runOnlyOnce ) p->expired = 1;
  }else if( p->rc && p->expired ){
    /* The expired flag was set on the VDBE before the first call
    ** to sqlite3_step(). For consistency (since sqlite3_step() was
    ** called), set the database error in this case as well.
    */
    sqlite3ErrorWithMsg(db, p->rc, p->zErrMsg ? "%s" : 0, p->zErrMsg);
    sqlite3DbFree(db, p->zErrMsg);
    p->zErrMsg = 0;
  }

  /* Reclaim all memory used by the VDBE
  */
  Cleanup(p);

  /* Save profiling information from this VDBE run.
  */
#ifdef VDBE_PROFILE
  {
    FILE *out = fopen("vdbe_profile.out", "a");
    if( out ){
      int i;
      fprintf(out, "---- ");
      for(i=0; i<p->nOp; i++){
        fprintf(out, "%02x", p->aOp[i].opcode);
      }
      fprintf(out, "\n");
      if( p->zSql ){
        char c, pc = 0;
        fprintf(out, "-- ");
        for(i=0; (c = p->zSql[i])!=0; i++){
          if( pc=='\n' ) fprintf(out, "-- ");
          putc(c, out);
          pc = c;
        }
        if( pc!='\n' ) fprintf(out, "\n");
      }
      for(i=0; i<p->nOp; i++){
        char zHdr[100];
        sqlite3_snprintf(sizeof(zHdr), zHdr, "%6u %12llu %8llu ",
           p->aOp[i].cnt,
           p->aOp[i].cycles,
           p->aOp[i].cnt>0 ? p->aOp[i].cycles/p->aOp[i].cnt : 0
        );
        fprintf(out, "%s", zHdr);
        sqlite3VdbePrintOp(out, i, &p->aOp[i]);
      }
      fclose(out);
    }
  }
#endif
  p->magic = VDBE_MAGIC_RESET;
  return p->rc & db->errMask;
}